

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

lyxml_attr * parse_attr(ly_ctx *ctx,char *data,uint *len,lyxml_elem *parent)

{
  char cVar1;
  lyxml_attr *plVar2;
  int iVar3;
  uint uVar4;
  lyxml_ns *plVar5;
  lyxml_attr *plVar6;
  char *pcVar7;
  ulong uVar8;
  lyxml_attr **pplVar9;
  char cVar10;
  char *pcVar11;
  size_t __n;
  char *local_58;
  lyxml_attr *local_48;
  uint local_3c;
  lyxml_attr *plStack_38;
  uint size;
  
  iVar3 = strncmp(data,"xmlns",5);
  plStack_38 = (lyxml_attr *)calloc(1,0x28);
  if (iVar3 == 0) {
    if (plStack_38 == (lyxml_attr *)0x0) goto LAB_00122d96;
    plStack_38->type = LYXML_ATTR_NS;
    plStack_38->ns = (lyxml_ns *)parent;
    if (data[5] != ':') {
      pcVar11 = data + 5;
      local_48 = (lyxml_attr *)0x0;
      goto LAB_00122dce;
    }
    local_58 = data + 6;
  }
  else {
    if (plStack_38 == (lyxml_attr *)0x0) {
LAB_00122d96:
      plStack_38 = (lyxml_attr *)0x0;
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_attr");
      return plStack_38;
    }
    plStack_38->type = LYXML_ATTR_STD;
    local_58 = data;
  }
  uVar4 = lyxml_getutf8(ctx,local_58,&local_3c);
  if (((uVar4 == 0x5f || uVar4 - 0x61 < 0x1a) || (uVar4 == 0x3a || uVar4 - 0x41 < 0x1a)) ||
     (uVar4 != 0x37e && uVar4 - 0x370 < 0x1c90)) {
LAB_00122b70:
    cVar10 = (*local_58 != 'x') * '\x03' + '\x01';
    pcVar11 = local_58 + local_3c;
    uVar4 = lyxml_getutf8(ctx,pcVar11,&local_3c);
    local_48 = (lyxml_attr *)0x0;
    do {
      if (((((0x19 < uVar4 - 0x61) && (uVar4 != 0x2d)) && (uVar4 != 0x5f)) &&
          ((10 < uVar4 - 0x30 && 0x19 < uVar4 - 0x41 && (uVar4 != 0x2e)))) &&
         ((uVar4 != 0xb7 && (uVar4 == 0x37e || 0x1c8f < uVar4 - 0x370)))) {
        if ((((0xdffff < uVar4 - 0x10000) && (0x20d < uVar4 - 0xfdf0)) && (0x4cf < uVar4 - 0xf900))
           && (((((0xa7fe < uVar4 - 0x3001 && (0x3ef < uVar4 - 0x2c00)) && (0x11f < uVar4 - 0x2070))
                && ((0x6f < uVar4 - 0x300 && ((uVar4 & 0xfffffffe) != 0x200c)))) &&
               (0x23f < uVar4 - 0xc0 || (uVar4 & 0xffffffdf) == 0xd7)))) goto LAB_00122f77;
      }
      if (plStack_38->type == LYXML_ATTR_STD) {
        cVar1 = *pcVar11;
        if (cVar10 == '\x03' || cVar1 != ':') {
          if ((cVar10 == '\x01' && cVar1 == 'm') || (cVar10 == '\x02' && cVar1 == 'l')) {
            cVar10 = cVar10 + '\x01';
          }
          else {
            cVar10 = '\x04';
          }
        }
        else {
          __n = (long)pcVar11 - (long)data;
          local_48 = (lyxml_attr *)malloc(__n + 1);
          if (local_48 == (lyxml_attr *)0x0) {
            local_48 = (lyxml_attr *)0x0;
            ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_attr");
            goto LAB_00122fc5;
          }
          local_58 = pcVar11 + 1;
          memcpy(local_48,data,__n);
          *(char *)((long)local_48 + __n) = '\0';
          plVar5 = lyxml_get_ns(parent,(char *)local_48);
          plStack_38->ns = plVar5;
        }
      }
      pcVar11 = pcVar11 + local_3c;
      uVar4 = lyxml_getutf8(ctx,pcVar11,&local_3c);
    } while( true );
  }
  if (((((uVar4 - 0x10000 < 0xe0000) || (uVar4 - 0xfdf0 < 0x20e)) ||
       ((uVar4 - 0xf900 < 0x4d0 || ((uVar4 - 0x3001 < 0xa7ff || (uVar4 - 0x2c00 < 0x3f0)))))) ||
      (uVar4 - 0x2070 < 0x120)) ||
     (((uVar4 & 0xfffffffe) == 0x200c || (uVar4 - 0xc0 < 0x240 && (uVar4 & 0xffffffdf) != 0xd7))))
  goto LAB_00122b70;
  ly_vlog(ctx,LYE_XML_INVAL,LY_VLOG_NONE,(void *)0x0,"NameStartChar of the attribute");
  local_48 = plStack_38;
  goto LAB_00122fd6;
LAB_00122f77:
  local_3c = (int)pcVar11 - (int)local_58;
  pcVar7 = lydict_insert(ctx,local_58,(ulong)local_3c);
  plStack_38->name = pcVar7;
LAB_00122dce:
  iVar3 = ((int)pcVar11 - (int)data) + 3;
  for (pcVar11 = pcVar11 + 2; uVar8 = (ulong)(byte)pcVar11[-2], uVar8 < 0x3e; pcVar11 = pcVar11 + 1)
  {
    if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
      if (uVar8 == 0x3d) goto LAB_00122e01;
      break;
    }
    iVar3 = iVar3 + 1;
  }
  pcVar11 = "attribute definition, \"=\" expected";
  goto LAB_00122fa9;
LAB_00122e01:
  uVar8 = (ulong)(byte)pcVar11[-1];
  if (0x27 < uVar8) goto LAB_00122fa2;
  if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
    if ((0x8400000000U >> (uVar8 & 0x3f) & 1) != 0) {
      pcVar11 = parse_text(ctx,pcVar11,pcVar11[-1],&local_3c);
      uVar4 = local_3c;
      if (local_3c != 0 || pcVar11 != (char *)0x0) {
        pcVar11 = lydict_insert_zc(ctx,pcVar11);
        plStack_38->value = pcVar11;
        *len = uVar4 + iVar3;
        plVar2 = parent->attr;
        if (parent->attr == (lyxml_attr *)0x0) {
          pplVar9 = &parent->attr;
        }
        else {
          do {
            plVar6 = plVar2;
            plVar2 = plVar6->next;
          } while (plVar2 != (lyxml_attr *)0x0);
          pplVar9 = &plVar6->next;
        }
        *pplVar9 = plStack_38;
        free(local_48);
        return plStack_38;
      }
      goto LAB_00122fc5;
    }
    goto LAB_00122fa2;
  }
  pcVar11 = pcVar11 + 1;
  iVar3 = iVar3 + 1;
  goto LAB_00122e01;
LAB_00122fa2:
  pcVar11 = "attribute value, \" or \' expected";
LAB_00122fa9:
  ly_vlog(ctx,LYE_XML_INVAL,LY_VLOG_NONE,(void *)0x0,pcVar11);
LAB_00122fc5:
  lyxml_free_attr(ctx,(lyxml_elem *)0x0,plStack_38);
LAB_00122fd6:
  free(local_48);
  return (lyxml_attr *)0x0;
}

Assistant:

static struct lyxml_attr *
parse_attr(struct ly_ctx *ctx, const char *data, unsigned int *len, struct lyxml_elem *parent)
{
    const char *c = data, *start, *delim;
    char *prefix = NULL, xml_flag, *str;
    int uc;
    struct lyxml_attr *attr = NULL, *a;
    unsigned int size;

    /* check if it is attribute or namespace */
    if (!strncmp(c, "xmlns", 5)) {
        /* namespace */
        attr = calloc(1, sizeof (struct lyxml_ns));
        LY_CHECK_ERR_RETURN(!attr, LOGMEM(ctx), NULL);

        attr->type = LYXML_ATTR_NS;
        ((struct lyxml_ns *)attr)->parent = parent;
        c += 5;
        if (*c != ':') {
            /* default namespace, prefix will be empty */
            goto equal;
        }
        c++;                    /* go after ':' to the prefix value */
    } else {
        /* attribute */
        attr = calloc(1, sizeof *attr);
        LY_CHECK_ERR_RETURN(!attr, LOGMEM(ctx), NULL);

        attr->type = LYXML_ATTR_STD;
    }

    /* process name part of the attribute */
    start = c;
    uc = lyxml_getutf8(ctx, c, &size);
    if (!is_xmlnamestartchar(uc)) {
        LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_NONE, NULL, "NameStartChar of the attribute");
        free(attr);
        return NULL;
    }
    xml_flag = 4;
    if (*c == 'x') {
        xml_flag = 1;
    }
    c += size;
    uc = lyxml_getutf8(ctx, c, &size);
    while (is_xmlnamechar(uc)) {
        if (attr->type == LYXML_ATTR_STD) {
            if ((*c == ':') && (xml_flag != 3)) {
                /* attribute in a namespace (but disregard the special "xml" namespace) */
                start = c + 1;

                /* look for the prefix in namespaces */
                prefix = malloc((c - data + 1) * sizeof *prefix);
                LY_CHECK_ERR_GOTO(!prefix, LOGMEM(ctx), error);
                memcpy(prefix, data, c - data);
                prefix[c - data] = '\0';
                attr->ns = lyxml_get_ns(parent, prefix);
            } else if (((*c == 'm') && (xml_flag == 1)) ||
                    ((*c == 'l') && (xml_flag == 2))) {
                ++xml_flag;
            } else {
                xml_flag = 4;
            }
        }
        c += size;
        uc = lyxml_getutf8(ctx, c, &size);
    }

    /* store the name */
    size = c - start;
    attr->name = lydict_insert(ctx, start, size);

equal:
    /* check Eq mark that can be surrounded by whitespaces */
    ign_xmlws(c);
    if (*c != '=') {
        LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_NONE, NULL, "attribute definition, \"=\" expected");
        goto error;
    }
    c++;
    ign_xmlws(c);

    /* process value part of the attribute */
    if (!*c || (*c != '"' && *c != '\'')) {
        LOGVAL(ctx, LYE_XML_INVAL, LY_VLOG_NONE, NULL, "attribute value, \" or \' expected");
        goto error;
    }
    delim = c;
    str = parse_text(ctx, ++c, *delim, &size);
    if (!str && !size) {
        goto error;
    }
    attr->value = lydict_insert_zc(ctx, str);

    *len = c + size + 1 - data; /* +1 is delimiter size */

    /* put attribute into the parent's attributes list */
    if (parent->attr) {
        /* go to the end of the list */
        for (a = parent->attr; a->next; a = a->next);
        /* and append new attribute */
        a->next = attr;
    } else {
        /* add the first attribute in the list */
        parent->attr = attr;
    }

    free(prefix);
    return attr;

error:
    lyxml_free_attr(ctx, NULL, attr);
    free(prefix);
    return NULL;
}